

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O1

void FinishDehPatch(void)

{
  PClassActor *cls;
  BYTE *pBVar1;
  AActor *defaults;
  bool bVar2;
  PClass *this;
  FName *pFVar3;
  long lVar4;
  int iVar5;
  PClassActor *info;
  FState *key;
  FName *pFVar6;
  Node *pNVar7;
  PClassActor *pPVar8;
  AmmoPerAttack *pAVar9;
  long lVar10;
  bool bVar11;
  ulong uVar12;
  FStateDefinitions statedef;
  char typeNameBuilder [32];
  FName local_a0;
  FName local_9c;
  undefined1 local_98 [16];
  FState *local_88;
  FState *pFStack_80;
  intptr_t local_78;
  TArray<FState,_FState> local_70;
  char local_58 [40];
  
  if (TouchedActors.Count != 0) {
    uVar12 = 0;
    do {
      cls = TouchedActors.Array[uVar12];
      pBVar1 = (cls->super_PClass).Defaults;
      if ((pBVar1[0x18c] & 1) != 0) {
        mysnprintf(local_58,0x20,"DehackedPickup%d",uVar12 & 0xffffffff);
        this = ADehackedPickup::RegistrationInfo.MyClass;
        local_9c.Index = FName::NameManager::FindName(&FName::NameData,local_58,false);
        info = (PClassActor *)PClass::CreateDerivedClass(this,&local_9c,0x4f0);
        defaults = (AActor *)(info->super_PClass).Defaults;
        memcpy(defaults,pBVar1,0x4a0);
        local_70.Array = (FState *)0x0;
        local_70.Most = 0;
        local_70.Count = 0;
        local_88 = (FState *)0x0;
        pFStack_80 = (FState *)0x0;
        local_98._0_8_ = (FStateDefine *)0x0;
        local_98._8_8_ = (Node *)0x0;
        local_78 = -1;
        FStateDefinitions::MakeStateDefines((FStateDefinitions *)local_98,cls);
        pPVar8 = cls;
        if (cls != (PClassActor *)AInventory::RegistrationInfo.MyClass) {
          do {
            pPVar8 = (PClassActor *)(pPVar8->super_PClass).ParentClass;
            if (pPVar8 == (PClassActor *)AInventory::RegistrationInfo.MyClass) break;
          } while (pPVar8 != (PClassActor *)0x0);
          if (pPVar8 == (PClassActor *)0x0) {
            FStateDefinitions::AddStateDefines
                      ((FStateDefinitions *)local_98,
                       *(FStateLabels **)
                        &AInventory::RegistrationInfo.MyClass[1].super_PStruct.super_PNamedType.
                         super_PCompoundType.super_PType.Align);
          }
        }
        FStateDefinitions::InstallStates((FStateDefinitions *)local_98,info,defaults);
        pPVar8 = cls->Replacement;
        cls->Replacement = info;
        info->Replacee = cls;
        if (pPVar8 != (PClassActor *)0x0) {
          info->Replacement = pPVar8;
        }
        DPrintf(3,"%s replaces %s\n",
                FName::NameData.NameArray
                [(info->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text);
        TArray<FState,_FState>::~TArray(&local_70);
        TArray<FStateDefine,_FStateDefine>::~TArray((TArray<FStateDefine,_FStateDefine> *)local_98);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < TouchedActors.Count);
  }
  if (StateMap.Count != 0) {
    StateMap.Count = 0;
  }
  TArray<StateMapper,_StateMapper>::ShrinkToFit(&StateMap);
  if (TouchedActors.Count != 0) {
    TouchedActors.Count = 0;
  }
  TArray<PClassActor_*,_PClassActor_*>::ShrinkToFit(&TouchedActors);
  if (WeaponNames.Count != 0) {
    uVar12 = 0;
    do {
      pBVar1 = (WeaponNames.Array[uVar12]->super_PClass).Defaults;
      if ((*(uint *)(pBVar1 + 0x1a0) >> 0x1c & 1) == 0) {
        pBVar1[0x4de] = pBVar1[0x4de] | 1;
        pBVar1[0x500] = '\0';
        pBVar1[0x501] = '\0';
        pBVar1[0x502] = '\0';
        pBVar1[0x503] = '\0';
        local_88 = (FState *)((ulong)local_88 & 0xffffffff);
        TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_>::SetNodeVector
                  ((TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_> *)local_98,1);
        local_a0.Index = 0x9f;
        key = PClassActor::FindState(WeaponNames.Array[uVar12],1,&local_a0,false);
        bVar11 = false;
        do {
          if (key == (FState *)0x0) break;
          pFVar3 = (FName *)local_98._0_8_ + (ulong)((hash_t)local_88 - 1 & (uint)key) * 6;
          do {
            pFVar6 = pFVar3;
            if ((pFVar6 == (FName *)0x0) || (*(FName **)pFVar6 == (FName *)0x1)) {
              pFVar6 = (FName *)0x0;
              break;
            }
            pFVar3 = *(FName **)pFVar6;
          } while ((FState *)((TArray<FStateDefine,_FStateDefine> *)(pFVar6 + 2))->Array != key);
          if ((pFVar6 == (FName *)0x0) || ((char)*(uint *)(pFVar6 + 4) == '\0')) {
            pNVar7 = TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_>::GetNode
                               ((TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_> *)
                                local_98,key);
            (pNVar7->Pair).Value = true;
            pAVar9 = AmmoPerAttacks;
            if ((VMNativeFunction *)key->ActionFunc != A_Punch_VMPtr) {
              lVar4 = 0;
              do {
                lVar10 = lVar4;
                if (lVar10 + 0x10 == 0xb0) goto LAB_004842f9;
                lVar4 = lVar10 + 0x10;
              } while ((VMNativeFunction *)key->ActionFunc !=
                       (VMNativeFunction *)**(long **)((long)&AmmoPerAttacks[1].func + lVar10));
              pAVar9 = (AmmoPerAttack *)(lVar10 + 0x8457a0);
            }
            iVar5 = pAVar9->ammocount;
            if (pAVar9->ammocount < 0) {
              iVar5 = deh.BFGCells;
            }
            *(int *)(pBVar1 + 0x500) = iVar5;
            bVar11 = true;
LAB_004842f9:
            if (bVar11) goto LAB_004842ff;
            key = key->NextState;
            bVar2 = true;
          }
          else {
LAB_004842ff:
            bVar2 = false;
          }
        } while (bVar2);
        M_Free((void *)local_98._0_8_);
      }
      else {
        *(uint *)(pBVar1 + 0x1a0) = *(uint *)(pBVar1 + 0x1a0) & 0xefffffff;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < WeaponNames.Count);
    if (WeaponNames.Count != 0) {
      WeaponNames.Count = 0;
    }
  }
  TArray<PClassActor_*,_PClassActor_*>::ShrinkToFit(&WeaponNames);
  return;
}

Assistant:

void FinishDehPatch ()
{
	unsigned int touchedIndex;

	for (touchedIndex = 0; touchedIndex < TouchedActors.Size(); ++touchedIndex)
	{
		PClassActor *type = TouchedActors[touchedIndex];
		AActor *defaults1 = GetDefaultByType (type);
		if (!(defaults1->flags & MF_SPECIAL))
		{ // We only need to do this for pickups
			continue;
		}

		// Create a new class that will serve as the actual pickup
		char typeNameBuilder[32];
		mysnprintf (typeNameBuilder, countof(typeNameBuilder), "DehackedPickup%d", touchedIndex);
		PClassActor *subclass = static_cast<PClassActor *>(RUNTIME_CLASS(ADehackedPickup)->
			CreateDerivedClass(typeNameBuilder, sizeof(ADehackedPickup)));
		AActor *defaults2 = GetDefaultByType (subclass);
		memcpy ((void *)defaults2, (void *)defaults1, sizeof(AActor));

		// Make a copy of the replaced class's state labels 
		FStateDefinitions statedef;
		statedef.MakeStateDefines(type);

		if (!type->IsDescendantOf(RUNTIME_CLASS(AInventory)))
		{
			// If this is a hacked non-inventory item we must also copy AInventory's special states
			statedef.AddStateDefines(RUNTIME_CLASS(AInventory)->StateList);
		}
		statedef.InstallStates(subclass, defaults2);

		// Use the DECORATE replacement feature to redirect all spawns
		// of the original class to the new one.
		PClassActor *old_replacement = type->Replacement;

		type->Replacement = subclass;
		subclass->Replacee = type;
		// If this actor was already replaced by another actor, copy that
		// replacement over to this item.
		if (old_replacement != NULL)
		{
			subclass->Replacement = old_replacement;
		}

		DPrintf (DMSG_NOTIFY, "%s replaces %s\n", subclass->TypeName.GetChars(), type->TypeName.GetChars());
	}

	// Now that all Dehacked patches have been processed, it's okay to free StateMap.
	StateMap.Clear();
	StateMap.ShrinkToFit();
	TouchedActors.Clear();
	TouchedActors.ShrinkToFit();

	// Now it gets nasty: We have to fiddle around with the weapons' ammo use info to make Doom's original
	// ammo consumption work as intended.

	for(unsigned i = 0; i < WeaponNames.Size(); i++)
	{
		AWeapon *weap = (AWeapon*)GetDefaultByType(WeaponNames[i]);
		bool found = false;
		if (weap->flags6 & MF6_INTRYMOVE)
		{
			// Weapon sets an explicit amount of ammo to use so we won't need any special processing here
			weap->flags6 &= ~MF6_INTRYMOVE;
		}
		else
		{
			weap->WeaponFlags |= WIF_DEHAMMO;
			weap->AmmoUse1 = 0;
			// to allow proper checks in CheckAmmo we have to find the first attack pointer in the Fire sequence
			// and set its default ammo use as the weapon's AmmoUse1.

			TMap<FState*, bool> StateVisited;

			FState *state = WeaponNames[i]->FindState(NAME_Fire);
			while (state != NULL)
			{
				bool *check = StateVisited.CheckKey(state);
				if (check != NULL && *check)
				{
					break;	// State has already been checked so we reached a loop
				}
				StateVisited[state] = true;
				for(unsigned j = 0; AmmoPerAttacks[j].func != NULL; j++)
				{
					if (state->ActionFunc == *AmmoPerAttacks[j].func)
					{
						found = true;
						int use = AmmoPerAttacks[j].ammocount;
						if (use < 0) use = deh.BFGCells;
						weap->AmmoUse1 = use;
						break;
					}
				}
				if (found) break;
				state = state->GetNextState();
			}
		}
	}
	WeaponNames.Clear();
	WeaponNames.ShrinkToFit();
}